

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_interactor.cc
# Opt level: O2

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  unsigned_short uVar2;
  int iVar3;
  uint uVar4;
  ssize_t sVar5;
  istream *piVar6;
  char *pcVar7;
  ulong uVar8;
  ostream *poVar9;
  runtime_error *prVar10;
  unsigned_short port;
  long lVar11;
  allocator local_213;
  allocator local_212;
  allocator local_211;
  ulong local_210;
  string line;
  char *toks;
  string tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string imp;
  size_t id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char buf [256];
  
  tag._M_dataplus._M_p = (pointer)&tag.field_2;
  tag._M_string_length = 0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  tag.field_2._M_local_buf[0] = '\0';
  line.field_2._M_local_buf[0] = '\0';
  uVar2 = 0xffff;
  if (argc < 2) {
    pcVar7 = "localhost";
  }
  else {
    pcVar7 = argv[1];
    if (argc != 2) {
      iVar3 = atoi(argv[2]);
      uVar2 = (unsigned_short)iVar3;
    }
  }
  port = 0x67ae;
  if (0x401 < (ushort)(uVar2 + 1)) {
    port = uVar2;
  }
  iVar3 = open_socket(pcVar7,port);
  id = 0;
  sVar5 = send(iVar3,&id,8,0);
  if (-1 < (int)sVar5) {
    local_210 = 0;
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&std::cin,(string *)&line);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
        close(iVar3);
        poVar9 = std::operator<<((ostream *)&std::cout,"Went through the data by doing ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)local_210);
        poVar9 = std::operator<<(poVar9," queries");
        std::endl<char,std::char_traits<char>>(poVar9);
        std::__cxx11::string::~string((string *)&line);
        std::__cxx11::string::~string((string *)&tag);
        return 0;
      }
      std::__cxx11::string::append((char *)&line);
      _Var1 = line._M_dataplus;
      lVar11 = (long)(int)line._M_string_length;
      pcVar7 = strchr(line._M_dataplus._M_p,0x20);
      sVar5 = send(iVar3,pcVar7 + 1,(size_t)(_Var1._M_p + (lVar11 - (long)(pcVar7 + 1))),0);
      if ((int)sVar5 < 0) break;
      uVar4 = recvall(iVar3,buf,0x100);
      buf[uVar4] = '\0';
      toks = buf;
      strsep(&toks," ");
      pcVar7 = strsep(&toks," ");
      if (pcVar7 == (char *)0x0) {
        std::__cxx11::string::string((string *)&imp,"\'empty",&local_212);
      }
      else {
        std::__cxx11::string::string((string *)&imp,pcVar7,&local_211);
      }
      std::__cxx11::string::operator=((string *)&tag,(string *)&imp);
      std::__cxx11::string::~string((string *)&imp);
      pcVar7 = strsep(&toks,"\n");
      if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
        std::__cxx11::string::string((string *)&local_158,pcVar7,&local_213);
        std::operator+(&local_1c0,&local_158," ");
        std::operator+(&local_1a0,&local_1c0,&tag);
        std::operator+(&imp,&local_1a0," |");
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_158);
        uVar8 = std::__cxx11::string::find_first_of((char *)&line,0x103079);
        std::__cxx11::string::replace((ulong)&line,uVar8,(string *)0x1);
        sVar5 = send(iVar3,line._M_dataplus._M_p,(long)(int)line._M_string_length,0);
        if ((int)sVar5 < 0) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"Could not send labeled data!");
          std::endl<char,std::char_traits<char>>(poVar9);
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar10,"Could not send labeled data!");
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        recvall(iVar3,buf,0x100);
        local_210 = (ulong)((int)local_210 + 1);
        std::__cxx11::string::~string((string *)&imp);
      }
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,"Could not send unlabeled data!");
    std::endl<char,std::char_traits<char>>(poVar9);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar10,"Could not send unlabeled data!");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar9 = std::operator<<((ostream *)&std::cerr,"Could not perform handshake!");
  std::endl<char,std::char_traits<char>>(poVar9);
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar10,"Could not perform handshake!");
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char* argv[])
{
  char buf[256];
  char *toks, *itok, *ttag;
  string tag;
  const char* host = "localhost";
  unsigned short port = ~0;
  ssize_t pos;
  int s, ret, queries = 0;
  string line;

  if (argc > 1)
  {
    host = argv[1];
  }
  if (argc > 2)
  {
    port = atoi(argv[2]);
  }
  if (port <= 1024 || port == (unsigned short)(~0))
  {
    port = 26542;
  }

  s = open_socket(host, port);
  size_t id = 0;
  ret = send(s, &id, sizeof(id), 0);
  if (ret < 0)
  {
    const char* msg = "Could not perform handshake!";
    cerr << msg << endl;
    throw runtime_error(msg);
  }

  while (getline(cin, line))
  {
    line.append("\n");
    int len = line.size();
    const char* cstr = line.c_str();
    const char* sp = strchr(cstr, ' ');
    ret = send(s, sp + 1, len - (sp + 1 - cstr), 0);
    if (ret < 0)
    {
      const char* msg = "Could not send unlabeled data!";
      cerr << msg << endl;
      throw runtime_error(msg);
    }
    ret = recvall(s, buf, 256);
    if (ret < 0)
    {
      const char* msg = "Could not receive queries!";
      cerr << msg << endl;
      throw runtime_error(msg);
    }
    buf[ret] = '\0';
    toks = &buf[0];
    strsep(&toks, " ");
    ttag = strsep(&toks, " ");
    tag = ttag ? string(ttag) : string("'empty");
    itok = strsep(&toks, "\n");
    if (itok == nullptr || itok[0] == '\0')
    {
      continue;
    }

    queries += 1;
    string imp = string(itok) + " " + tag + " |";
    pos = line.find_first_of("|");
    line.replace(pos, 1, imp);
    cstr = line.c_str();
    len = line.size();
    ret = send(s, cstr, len, 0);
    if (ret < 0)
    {
      const char* msg = "Could not send labeled data!";
      cerr << msg << endl;
      throw runtime_error(msg);
    }
    ret = recvall(s, buf, 256);
    if (ret < 0)
    {
      const char* msg = "Could not receive predictions!";
      cerr << msg << endl;
      throw runtime_error(msg);
    }
  }
  close(s);
  cout << "Went through the data by doing " << queries << " queries" << endl;
  return 0;
}